

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.h
# Opt level: O0

void __thiscall
dg::Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::removeIncomingUses
          (Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode> *this)

{
  bool bVar1;
  Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode> *in_RDI;
  LLVMNode *cd;
  LLVMNode *in_stack_ffffffffffffffd8;
  
  while( true ) {
    bVar1 = DGContainer<dg::LLVMNode_*,_4U>::empty((DGContainer<dg::LLVMNode_*,_4U> *)0x1d2104);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    DGContainer<dg::LLVMNode_*,_4U>::begin
              ((DGContainer<dg::LLVMNode_*,_4U> *)in_stack_ffffffffffffffd8);
    std::_Rb_tree_const_iterator<dg::LLVMNode_*>::operator*
              ((_Rb_tree_const_iterator<dg::LLVMNode_*> *)0x1d212c);
    removeUseDependence(in_RDI,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

void removeIncomingUses() {
        while (!userEdges.empty()) {
            NodeT *cd = *userEdges.begin();
            // this will remove the reverse control dependence from
            // this node
            cd->removeUseDependence(static_cast<NodeT *>(this));
        }
    }